

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int get_int_const(gen_ctx_t gen_ctx,MIR_op_t *op_ref,int64_t *c)

{
  void *pvVar1;
  uint64_t uVar2;
  ssa_edge_t_conflict se;
  int64_t *c_local;
  MIR_op_t *op_ref_local;
  gen_ctx_t gen_ctx_local;
  
  c_local = (int64_t *)op_ref;
  if ((*(ushort *)&op_ref->field_0x8 & 0xff) == 2) {
    pvVar1 = op_ref->data;
    if ((pvVar1 == (void *)0x0) || ((int)*(undefined8 *)(**(long **)((long)pvVar1 + 8) + 0x18) != 0)
       ) {
      return 0;
    }
    c_local = (int64_t *)(**(long **)((long)pvVar1 + 8) + 0x50);
  }
  if (((*(ushort *)(c_local + 1) & 0xff) == 3) || ((*(ushort *)(c_local + 1) & 0xff) == 4)) {
    *c = c_local[2];
  }
  else {
    if (((*(ushort *)(c_local + 1) & 0xff) != 8) || (*(int *)(c_local[2] + 0x20) == 0)) {
      return 0;
    }
    uVar2 = get_ref_value(gen_ctx,(MIR_op_t *)c_local);
    *c = uVar2;
  }
  return 1;
}

Assistant:

static int get_int_const (gen_ctx_t gen_ctx, MIR_op_t *op_ref, int64_t *c) {
  if (op_ref->mode == MIR_OP_VAR) {
    ssa_edge_t se = op_ref->data;
    if (se == NULL || se->def->insn->code != MIR_MOV) return FALSE;
    op_ref = &se->def->insn->ops[1];
  }
  if (op_ref->mode == MIR_OP_INT || op_ref->mode == MIR_OP_UINT) {
    *c = op_ref->u.i;
  } else if (op_ref->mode == MIR_OP_REF && op_ref->u.ref->item_type != MIR_func_item) {
    *c = get_ref_value (gen_ctx, op_ref);
  } else {
    return FALSE;
  }
  return TRUE;
}